

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

Node * PruneSection(TidyDocImpl *doc,Node *node)

{
  Lexer *lexer;
  Node **ppNVar1;
  int iVar2;
  Node *check;
  Node *pNVar3;
  
  if (node != (Node *)0x0) {
    lexer = doc->lexer;
    do {
      iVar2 = prvTidytmbstrncmp(lexer->lexbuf + node->start,"if !supportEmptyParas",0x15);
      pNVar3 = node;
      if (iVar2 == 0) {
        do {
          if ((pNVar3->tag != (Dict *)0x0) && (pNVar3->tag->id == TidyTag_TD)) {
            pNVar3 = prvTidyNewLiteralTextNode(lexer,anon_var_dwarf_2f9ed);
            prvTidyInsertNodeBeforeElement(node,pNVar3);
            break;
          }
          ppNVar1 = &pNVar3->parent;
          pNVar3 = *ppNVar1;
        } while (*ppNVar1 != (Node *)0x0);
      }
      if (node->type == TextNode) {
        node = node->next;
      }
      else {
        node = prvTidyDiscardElement(doc,node);
      }
      if (node == (Node *)0x0) {
        return (Node *)0x0;
      }
      if (node->type == SectionTag) {
        iVar2 = prvTidytmbstrncmp(lexer->lexbuf + node->start,"if",2);
        if (iVar2 == 0) {
          node = PruneSection(doc,node);
        }
        else {
          iVar2 = prvTidytmbstrncmp(lexer->lexbuf + node->start,"endif",5);
          if (iVar2 == 0) {
            pNVar3 = prvTidyDiscardElement(doc,node);
            return pNVar3;
          }
        }
      }
    } while (node != (Node *)0x0);
  }
  return (Node *)0x0;
}

Assistant:

static Node* PruneSection( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    for (;;)
    {
        if (node == NULL)
            return NULL;
        
        ctmbstr lexbuf = lexer->lexbuf + node->start;
        if ( TY_(tmbstrncmp)(lexbuf, "if !supportEmptyParas", 21) == 0 )
        {
          Node* cell = FindEnclosingCell( doc, node );
          if ( cell )
          {
            /* Need to put &nbsp; into cell so it doesn't look weird
            */
            Node* nbsp = TY_(NewLiteralTextNode)( lexer, "\240" );
            assert( (byte)'\240' == (byte)160 );
            TY_(InsertNodeBeforeElement)( node, nbsp );
          }
        }

        /* discard node and returns next, unless it is a text node */
        if ( node->type == TextNode )
            node = node->next;
        else
            node = TY_(DiscardElement)( doc, node );

        if (node == NULL)
            return NULL;
        
        if (node->type == SectionTag)
        {
            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "if", 2) == 0)
            {
                node = PruneSection( doc, node );
                continue;
            }

            if (TY_(tmbstrncmp)(lexer->lexbuf + node->start, "endif", 5) == 0)
            {
                node = TY_(DiscardElement)( doc, node );
                break;
            }
        }
    }

    return node;
}